

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O1

IterateResult __thiscall deqp::gls::LongStressCase::iterate(LongStressCase *this)

{
  string *manglingSuffix;
  vector<int,_std::allocator<int>_> *this_00;
  Random *rnd;
  VarSpec *attrSpec;
  pointer puVar1;
  ostringstream *this_01;
  ostringstream *this_02;
  ostringstream *this_03;
  ostringstream *this_04;
  float fVar2;
  float fVar3;
  pointer pPVar4;
  long lVar5;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Program> *this_05;
  Program *pPVar6;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *pGVar7;
  Texture *this_06;
  int *piVar8;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *pGVar9;
  Buffer *pBVar10;
  pointer src;
  pointer puVar11;
  pointer piVar12;
  size_t __n;
  DebugInfoRenderer *this_07;
  int iVar13;
  deUint32 dVar14;
  ChannelOrder CVar15;
  int iVar16;
  int bufMem;
  GLenum GVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pPVar18;
  long *plVar19;
  undefined8 *puVar20;
  deUint64 dVar21;
  const_iterator cVar22;
  const_iterator cVar23;
  const_iterator cVar24;
  const_iterator cVar25;
  const_iterator cVar26;
  const_iterator cVar27;
  vector<int,_std::allocator<int>_> *this_08;
  deUint64 dVar28;
  ostream *poVar29;
  TestLog *pTVar30;
  pointer attrDataBuf;
  size_type *psVar31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  long *plVar33;
  ulong uVar34;
  uint uVar35;
  int precision;
  int precision_00;
  int precision_01;
  int precision_02;
  int precision_03;
  _Rb_tree_header *p_Var36;
  iterator __position;
  undefined8 uVar37;
  TestLog TVar38;
  ChannelOrder CVar39;
  long lVar40;
  int i;
  long lVar41;
  long lVar42;
  uint uVar43;
  long lVar44;
  long lVar45;
  bool bVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>_>
  pVar52;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
  pVar53;
  string unitedAttrBufferNamePrefix;
  string indexBufferName;
  string textureNamePrefix;
  string texName;
  string separateAttrBufNamePrefix;
  string programName;
  ostringstream s;
  vector<int,_std::allocator<int>_> texSpecIndices;
  long local_e78;
  long local_e70;
  long *local_e40;
  long local_e30;
  long lStack_e28;
  key_type local_e20;
  long *local_e00;
  long local_df8;
  long local_df0;
  long lStack_de8;
  GLsizei local_de0;
  GLsizei local_ddc;
  undefined1 local_dd8 [8];
  size_type local_dd0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_dc8 [6];
  ios_base local_d60 [264];
  long *local_c58;
  long local_c50;
  long local_c48;
  long lStack_c40;
  key_type local_c38;
  undefined1 local_c18 [8];
  ostringstream local_c10 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c08 [6];
  ios_base local_ba8 [8];
  ios_base local_ba0 [264];
  TestLog *local_a98;
  string local_a90;
  undefined1 local_a70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a60 [6];
  ios_base local_9f8 [264];
  string local_8f0;
  string *local_8d0;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  long *local_848;
  long local_840;
  long local_838 [2];
  long *local_828 [2];
  long local_818 [2];
  long *local_808 [2];
  long local_7f8 [2];
  undefined1 local_7e8 [16];
  TestLog local_7d8;
  long lStack_7d0;
  ios_base local_770 [264];
  LogSection local_668;
  string local_628 [3];
  ios_base local_5b8 [264];
  undefined1 local_4b0 [16];
  TestLog local_4a0 [13];
  ios_base local_438 [264];
  undefined1 local_330 [16];
  TestLog local_320 [13];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [384];
  
  local_a98 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar13 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  local_ddc = *(GLsizei *)CONCAT44(extraout_var,iVar13);
  iVar13 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  local_de0 = *(GLsizei *)(CONCAT44(extraout_var_00,iVar13) + 4);
  rnd = &this->m_rnd;
  fVar47 = deRandom_getFloat(&rnd->m_rnd);
  fVar51 = (this->m_probabilities).clientMemoryIndexData;
  fVar48 = deRandom_getFloat(&rnd->m_rnd);
  fVar2 = (this->m_probabilities).useDrawArrays;
  fVar49 = deRandom_getFloat(&rnd->m_rnd);
  fVar3 = (this->m_probabilities).separateAttributeBuffers;
  pPVar18 = (this->m_programContexts).
            super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pPVar4 = (this->m_programContexts).
           super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar14 = deRandom_getUint32(&rnd->m_rnd);
  uVar35 = dVar14 % (uint)((int)((ulong)((long)pPVar18 - (long)pPVar4) >> 3) * 0x3cf3cf3d);
  pPVar18 = (this->m_programContexts).
            super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
            ._M_impl.super__Vector_impl_data._M_start + (int)uVar35;
  attrDataBuf = (this->m_programResources).
                super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
                ._M_impl.super__Vector_impl_data._M_start + (int)uVar35;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c18);
  std::ostream::operator<<((ostringstream *)local_c18,uVar35);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c18);
  std::ios_base::~ios_base(local_ba8);
  plVar19 = (long *)std::__cxx11::string::replace((ulong)local_dd8,0,(char *)0x0,0x67ea90);
  local_c38._M_dataplus._M_p = (pointer)&local_c38.field_2;
  psVar31 = (size_type *)(plVar19 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar31) {
    local_c38.field_2._M_allocated_capacity = *psVar31;
    local_c38.field_2._8_8_ = plVar19[3];
  }
  else {
    local_c38.field_2._M_allocated_capacity = *psVar31;
    local_c38._M_dataplus._M_p = (pointer)*plVar19;
  }
  local_c38._M_string_length = plVar19[1];
  *plVar19 = (long)psVar31;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  if (local_dd8 != (undefined1  [8])local_dc8) {
    operator_delete((void *)local_dd8,local_dc8[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c18);
  std::ostream::operator<<(local_c18,uVar35);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c18);
  std::ios_base::~ios_base(local_ba8);
  plVar19 = (long *)std::__cxx11::string::replace((ulong)local_a70,0,(char *)0x0,0x65666a);
  local_dd8 = (undefined1  [8])local_dc8;
  paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar19 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 == paVar32) {
    local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
    local_dc8[0]._8_8_ = plVar19[3];
  }
  else {
    local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
    local_dd8 = (undefined1  [8])*plVar19;
  }
  local_dd0 = plVar19[1];
  *plVar19 = (long)paVar32;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append(local_dd8);
  local_e00 = &local_df0;
  plVar33 = plVar19 + 2;
  if ((long *)*plVar19 == plVar33) {
    local_df0 = *plVar33;
    lStack_de8 = plVar19[3];
  }
  else {
    local_df0 = *plVar33;
    local_e00 = (long *)*plVar19;
  }
  local_df8 = plVar19[1];
  *plVar19 = (long)plVar33;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  if (local_dd8 != (undefined1  [8])local_dc8) {
    operator_delete((void *)local_dd8,local_dc8[0]._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_a70._0_8_ != (TestLog *)(local_a70 + 0x10)) {
    operator_delete((void *)local_a70._0_8_,(ulong)(local_a60[0]._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c18);
  std::ostream::operator<<(local_c18,uVar35);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c18);
  std::ios_base::~ios_base(local_ba8);
  plVar19 = (long *)std::__cxx11::string::replace((ulong)local_a70,0,(char *)0x0,0x67ea95);
  local_dd8 = (undefined1  [8])local_dc8;
  paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar19 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 == paVar32) {
    local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
    local_dc8[0]._8_8_ = plVar19[3];
  }
  else {
    local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
    local_dd8 = (undefined1  [8])*plVar19;
  }
  local_dd0 = plVar19[1];
  *plVar19 = (long)paVar32;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append(local_dd8);
  local_e40 = &local_e30;
  plVar33 = plVar19 + 2;
  if ((long *)*plVar19 == plVar33) {
    local_e30 = *plVar33;
    lStack_e28 = plVar19[3];
  }
  else {
    local_e30 = *plVar33;
    local_e40 = (long *)*plVar19;
  }
  lVar5 = plVar19[1];
  *plVar19 = (long)plVar33;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  if (local_dd8 != (undefined1  [8])local_dc8) {
    operator_delete((void *)local_dd8,local_dc8[0]._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_a70._0_8_ != (TestLog *)(local_a70 + 0x10)) {
    operator_delete((void *)local_a70._0_8_,(ulong)(local_a60[0]._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c18);
  std::ostream::operator<<(local_c18,uVar35);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c18);
  std::ios_base::~ios_base(local_ba8);
  plVar19 = (long *)std::__cxx11::string::replace((ulong)local_dd8,0,(char *)0x0,0x67ea9d);
  local_e20._M_dataplus._M_p = (pointer)&local_e20.field_2;
  psVar31 = (size_type *)(plVar19 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar31) {
    local_e20.field_2._M_allocated_capacity = *psVar31;
    local_e20.field_2._8_8_ = plVar19[3];
  }
  else {
    local_e20.field_2._M_allocated_capacity = *psVar31;
    local_e20._M_dataplus._M_p = (pointer)*plVar19;
  }
  local_e20._M_string_length = plVar19[1];
  *plVar19 = (long)psVar31;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  if (local_dd8 != (undefined1  [8])local_dc8) {
    operator_delete((void *)local_dd8,local_dc8[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c18);
  std::ostream::operator<<(local_c18,uVar35);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c18);
  std::ios_base::~ios_base(local_ba8);
  puVar20 = (undefined8 *)std::__cxx11::string::replace((ulong)local_a70,0,(char *)0x0,0x67ea95);
  local_dd8 = (undefined1  [8])local_dc8;
  paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar20 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar20 == paVar32) {
    local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
    local_dc8[0]._8_8_ = puVar20[3];
  }
  else {
    local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
    local_dd8 = (undefined1  [8])*puVar20;
  }
  local_dd0 = puVar20[1];
  *puVar20 = paVar32;
  puVar20[1] = 0;
  *(undefined1 *)(puVar20 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append(local_dd8);
  local_c58 = &local_c48;
  plVar33 = plVar19 + 2;
  if ((long *)*plVar19 == plVar33) {
    local_c48 = *plVar33;
    lStack_c40 = plVar19[3];
  }
  else {
    local_c48 = *plVar33;
    local_c58 = (long *)*plVar19;
  }
  local_c50 = plVar19[1];
  *plVar19 = (long)plVar33;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  if (local_dd8 != (undefined1  [8])local_dc8) {
    operator_delete((void *)local_dd8,(ulong)(local_dc8[0]._M_allocated_capacity + 1));
  }
  if ((TestLog *)local_a70._0_8_ != (TestLog *)(local_a70 + 0x10)) {
    operator_delete((void *)local_a70._0_8_,(ulong)(local_a60[0]._M_allocated_capacity + 1));
  }
  if (this->m_currentIteration == 0) {
    dVar21 = deGetTime();
    this->m_startTimeSeconds = dVar21;
    this->m_lastLogTime = dVar21;
  }
  this_05 = this->m_programs;
  cVar22 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>_>
                   *)this_05,&local_c38);
  p_Var36 = &(this_05->m_objects)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar22._M_node == p_Var36) {
    LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Program>::make
              (this->m_programs,&local_c38);
  }
  cVar23 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>_>
                   *)this->m_programs,&local_c38);
  pPVar6 = *(Program **)(cVar23._M_node + 2);
  if (((_Rb_tree_header *)cVar22._M_node == p_Var36) ||
     (fVar50 = deRandom_getFloat(&rnd->m_rnd), fVar50 < (this->m_probabilities).rebuildProgram)) {
    deGetTime();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c18);
    std::ostream::_M_insert<unsigned_long>((ulong)local_c18);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c18);
    std::ios_base::~ios_base(local_ba8);
    manglingSuffix = &attrDataBuf->shaderNameManglingSuffix;
    std::__cxx11::string::operator=((string *)manglingSuffix,(string *)local_dd8);
    if (local_dd8 != (undefined1  [8])local_dc8) {
      operator_delete((void *)local_dd8,(ulong)(local_dc8[0]._M_allocated_capacity + 1));
    }
    mangleShaderNames((string *)local_c18,&pPVar18->vertexSource,manglingSuffix);
    mangleShaderNames((string *)local_dd8,&pPVar18->fragmentSource,manglingSuffix);
    LongStressCaseInternal::Program::setSources(pPVar6,(string *)local_c18,(string *)local_dd8);
    pTVar30 = local_a98;
    if (local_dd8 != (undefined1  [8])local_dc8) {
      operator_delete((void *)local_dd8,(ulong)(local_dc8[0]._M_allocated_capacity + 1));
    }
    if (local_c18 != (undefined1  [8])local_c08) {
      operator_delete((void *)local_c18,local_c08[0]._M_allocated_capacity + 1);
    }
    LongStressCaseInternal::Program::build(pPVar6,pTVar30);
  }
  glwUseProgram(pPVar6->m_programGL);
  cVar22 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>_>
                   *)this->m_programs,&local_c38);
  pPVar6 = *(Program **)(cVar22._M_node + 2);
  if (0 < (int)((ulong)((long)(pPVar18->textureSpecs).
                              super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       *(long *)&(pPVar18->textureSpecs).
                                 super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                                 ._M_impl) >> 4) * -0x33333333) {
    lVar44 = 0x2c;
    local_e70 = 0;
    lVar42 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c18);
      std::ostream::operator<<((ostringstream *)local_c18,(int)lVar42);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c18);
      std::ios_base::~ios_base(local_ba8);
      puVar20 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_a70,0,(char *)0x0,(ulong)local_e00);
      local_dd8 = (undefined1  [8])local_dc8;
      paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar20 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 == paVar32) {
        local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
        local_dc8[0]._8_8_ = puVar20[3];
      }
      else {
        local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
        local_dd8 = (undefined1  [8])*puVar20;
      }
      local_dd0 = puVar20[1];
      *puVar20 = paVar32;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      if ((TestLog *)local_a70._0_8_ != (TestLog *)(local_a70 + 0x10)) {
        operator_delete((void *)local_a70._0_8_,(ulong)(local_a60[0]._M_allocated_capacity + 1));
      }
      pGVar7 = this->m_textures;
      cVar24 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>_>
                       *)pGVar7,(key_type *)local_dd8);
      p_Var36 = &(pGVar7->m_objects)._M_t._M_impl.super__Rb_tree_header;
      lVar45 = *(long *)&(pPVar18->textureSpecs).
                         super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                         ._M_impl;
      if ((_Rb_tree_header *)cVar24._M_node == p_Var36) {
        LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::make
                  (this->m_textures,(string *)local_dd8,*(TextureType *)(lVar45 + -0x2c + lVar44));
LAB_0047d259:
        cVar25 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>_>
                         *)this->m_textures,(key_type *)local_dd8);
        this_06 = *(Texture **)(cVar25._M_node + 2);
        pGVar7 = this->m_textures;
        iVar13 = this->m_maxTexMemoryUsageBytes;
        iVar16 = LongStressCaseInternal::Texture::getApproxMemUsageDiff
                           (this_06,*(int *)(lVar45 + -0x24 + lVar44),
                            *(int *)(lVar45 + -0x20 + lVar44),*(deUint32 *)(lVar45 + -0x14 + lVar44)
                            ,*(bool *)(lVar45 + -0x10 + lVar44));
        LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::
        removeGarbageUntilUnder(pGVar7,iVar13 - iVar16,rnd);
        if (((_Rb_tree_header *)cVar24._M_node == p_Var36) ||
           (fVar50 = deRandom_getFloat(&rnd->m_rnd),
           fVar50 < (this->m_probabilities).reuploadWithTexImage)) {
          tcu::TextureLevel::getAccess
                    ((PixelBufferAccess *)local_c18,
                     *(TextureLevel **)
                      ((long)&((attrDataBuf->dummyTextures).
                               super__Vector_base<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_ptr + local_e70));
          LongStressCaseInternal::Texture::setData
                    (this_06,(ConstPixelBufferAccess *)local_c18,*(int *)(lVar45 + -0x24 + lVar44),
                     *(int *)(lVar45 + -0x20 + lVar44),*(deUint32 *)(lVar45 + -0x14 + lVar44),
                     *(bool *)(lVar45 + -0x10 + lVar44));
        }
        else {
          tcu::TextureLevel::getAccess
                    ((PixelBufferAccess *)local_c18,
                     *(TextureLevel **)
                      ((long)&((attrDataBuf->dummyTextures).
                               super__Vector_base<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_ptr + local_e70));
          LongStressCaseInternal::Texture::setSubData
                    (this_06,(ConstPixelBufferAccess *)local_c18,0,0,
                     *(int *)(lVar45 + -0x24 + lVar44),*(int *)(lVar45 + -0x20 + lVar44));
        }
        glwActiveTexture(0x84c0);
        GVar17 = 0x8513;
        if (this_06->m_type == TEXTURETYPE_2D) {
          GVar17 = 0xde1;
        }
        glwBindTexture(GVar17,this_06->m_textureGL);
        LongStressCaseInternal::Texture::setWrap
                  (this_06,*(deUint32 *)(lVar45 + -4 + lVar44),*(deUint32 *)(lVar45 + lVar44));
        LongStressCaseInternal::Texture::setFilter
                  (this_06,*(deUint32 *)(lVar45 + -0xc + lVar44),*(deUint32 *)(lVar45 + -8 + lVar44)
                  );
      }
      else {
        fVar50 = deRandom_getFloat(&rnd->m_rnd);
        if (fVar50 < (this->m_probabilities).reuploadTexture) goto LAB_0047d259;
      }
      if (local_dd8 != (undefined1  [8])local_dc8) {
        operator_delete((void *)local_dd8,(ulong)(local_dc8[0]._M_allocated_capacity + 1));
      }
      lVar42 = lVar42 + 1;
      lVar44 = lVar44 + 0x50;
      local_e70 = local_e70 + 0x10;
    } while (lVar42 < (int)((ulong)((long)(pPVar18->textureSpecs).
                                          super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   *(long *)&(pPVar18->textureSpecs).
                                             super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                                             ._M_impl) >> 4) * -0x33333333);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_7e8,
             ((long)(pPVar18->textureSpecs).
                    super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              *(long *)&(pPVar18->textureSpecs).
                        super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                        ._M_impl >> 4) * -0x3333333333333333,(allocator_type *)local_c18);
  uVar35 = (uint)((ulong)(local_7e8._8_8_ - local_7e8._0_8_) >> 2);
  if (0 < (int)uVar35) {
    uVar34 = 0;
    do {
      *(int *)(local_7e8._0_8_ + uVar34 * 4) = (int)uVar34;
      uVar34 = uVar34 + 1;
    } while ((uVar35 & 0x7fffffff) != uVar34);
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (rnd,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_7e8._0_8_,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_7e8._8_8_);
  if (0 < (int)((ulong)(local_7e8._8_8_ - local_7e8._0_8_) >> 2)) {
    lVar42 = 1;
    lVar44 = 0;
    do {
      uVar37 = local_7e8._0_8_;
      pGVar7 = this->m_textures;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c18);
      std::ostream::operator<<
                ((ostringstream *)local_c18,*(int *)((long)(qpTestLog **)uVar37 + lVar44 * 4));
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c18);
      std::ios_base::~ios_base(local_ba8);
      puVar20 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_a70,0,(char *)0x0,(ulong)local_e00);
      local_dd8 = (undefined1  [8])local_dc8;
      paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar20 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 == paVar32) {
        local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
        local_dc8[0]._8_8_ = puVar20[3];
      }
      else {
        local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
        local_dd8 = (undefined1  [8])*puVar20;
      }
      local_dd0 = puVar20[1];
      *puVar20 = paVar32;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      cVar24 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>_>
                       *)pGVar7,(key_type *)local_dd8);
      piVar8 = *(int **)(cVar24._M_node + 2);
      glwActiveTexture(*(int *)(*(long *)&(pPVar18->textureSpecs).
                                          super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                                          ._M_impl + lVar42 * 4) + 0x84c0);
      GVar17 = 0x8513;
      if (*piVar8 == 0) {
        GVar17 = 0xde1;
      }
      glwBindTexture(GVar17,piVar8[1]);
      if (local_dd8 != (undefined1  [8])local_dc8) {
        operator_delete((void *)local_dd8,(ulong)(local_dc8[0]._M_allocated_capacity + 1));
      }
      if ((TestLog *)local_a70._0_8_ != (TestLog *)(local_a70 + 0x10)) {
        operator_delete((void *)local_a70._0_8_,(ulong)(local_a60[0]._M_allocated_capacity + 1));
      }
      lVar44 = lVar44 + 1;
      lVar42 = lVar42 + 0x14;
    } while (lVar44 < (int)((ulong)(local_7e8._8_8_ - local_7e8._0_8_) >> 2));
  }
  if ((TestLog *)local_7e8._0_8_ != (TestLog *)0x0) {
    operator_delete((void *)local_7e8._0_8_,(long)local_7d8.m_log - local_7e8._0_8_);
  }
  if ((fVar2 <= fVar48) &&
     (de::Random::
      shuffle<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                (rnd,(__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      )(this->m_vertexIndices).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  )(this->m_vertexIndices).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish), fVar51 <= fVar47)) {
    pGVar9 = this->m_buffers;
    cVar26 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                     *)pGVar9,&local_e20);
    p_Var36 = &(pGVar9->m_objects)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar26._M_node == p_Var36) {
      LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::make
                (this->m_buffers,&local_e20);
    }
    cVar27 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                     *)this->m_buffers,&local_e20);
    pBVar10 = *(Buffer **)(cVar27._M_node + 2);
    if (((_Rb_tree_header *)cVar26._M_node == p_Var36) ||
       (fVar50 = deRandom_getFloat(&rnd->m_rnd), fVar50 < (this->m_probabilities).reuploadBuffer)) {
      LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
      removeGarbageUntilUnder
                (this->m_buffers,
                 (pBVar10->m_dataSizeApprox + this->m_maxBufMemoryUsageBytes) -
                 (*(int *)&(this->m_vertexIndices).
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                  *(int *)&(this->m_vertexIndices).
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start & 0xfffffffeU),rnd);
      fVar50 = deRandom_getFloat(&rnd->m_rnd);
      CVar15 = 0x8893;
      if (fVar50 < (this->m_probabilities).randomBufferUploadTarget) {
        if (this->m_isGLES3 == true) {
          local_c18 = (undefined1  [8])((ulong)(uint)local_c18._4_4_ << 0x20);
          de::Random::choose<unsigned_int_const*,unsigned_int*>
                    (rnd,(uint *)bufferTargets,(uint *)&bufferTargetsGLES2,(uint *)local_c18,1);
        }
        else {
          local_c18 = (undefined1  [8])((ulong)(uint)local_c18._4_4_ << 0x20);
          de::Random::choose<unsigned_int_const*,unsigned_int*>
                    (rnd,(uint *)&bufferTargetsGLES2,(uint *)&DAT_0067e4a8,(uint *)local_c18,1);
        }
        CVar15 = local_c18._0_4_;
      }
      if (((_Rb_tree_header *)cVar26._M_node == p_Var36) ||
         (fVar50 = deRandom_getFloat(&rnd->m_rnd),
         fVar50 < (this->m_probabilities).reuploadWithBufferData)) {
        fVar50 = deRandom_getFloat(&rnd->m_rnd);
        if ((this->m_probabilities).randomBufferUsage <= fVar50) {
          CVar39 = this->m_indexBufferUsage;
        }
        else {
          if (this->m_isGLES3 == true) {
            local_c18 = (undefined1  [8])((ulong)(uint)local_c18._4_4_ << 0x20);
            de::Random::choose<unsigned_int_const*,unsigned_int*>
                      (rnd,(uint *)bufferUsages,(uint *)bufferUsagesGLES2,(uint *)local_c18,1);
          }
          else {
            local_c18 = (undefined1  [8])((ulong)(uint)local_c18._4_4_ << 0x20);
            de::Random::choose<unsigned_int_const*,unsigned_int*>
                      (rnd,(uint *)bufferUsagesGLES2,(uint *)&DAT_0067e4e0,(uint *)local_c18,1);
          }
          CVar39 = local_c18._0_4_;
        }
        src = (this->m_vertexIndices).
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start;
        LongStressCaseInternal::Buffer::setData
                  (pBVar10,src,
                   *(int *)&(this->m_vertexIndices).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (int)src & 0xfffffffe,CVar15
                   ,CVar39);
      }
      else {
        LongStressCaseInternal::Buffer::setSubData
                  (pBVar10,(this->m_vertexIndices).
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start,0,
                   this->m_numVerticesPerDrawCall * 2,CVar15);
      }
    }
  }
  uVar35 = this->m_numVerticesPerDrawCall;
  puVar11 = (attrDataBuf->attrDataBuf).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((attrDataBuf->attrDataBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar11) {
    (attrDataBuf->attrDataBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar11;
  }
  this_00 = &attrDataBuf->attrDataSizes;
  piVar12 = (attrDataBuf->attrDataOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((attrDataBuf->attrDataOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar12) {
    (attrDataBuf->attrDataOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar12;
  }
  std::vector<int,_std::allocator<int>_>::resize
            (this_00,((long)(pPVar18->attributes).
                            super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pPVar18->attributes).
                            super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3);
  this_08 = &attrDataBuf->attrDataOffsets;
  lVar42 = (long)(pPVar18->attributes).
                 super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>._M_impl
                 .super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pPVar18->attributes).
                              super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                              ._M_impl.super__Vector_impl_data._M_finish - lVar42) >> 3) *
          0x3cf3cf3d) {
    lVar44 = 0;
    do {
      attrSpec = (VarSpec *)(lVar42 + lVar44 * 0xa8);
      __n = *(size_t *)(lVar42 + lVar44 * 0xa8 + 8);
      if ((__n == (pPVar18->positionAttrName)._M_string_length) &&
         ((__n == 0 ||
          (iVar13 = bcmp((attrSpec->name)._M_dataplus._M_p,
                         (pPVar18->positionAttrName)._M_dataplus._M_p,__n), iVar13 == 0)))) {
        piVar12 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        iVar13 = glu::getDataTypeScalarSize(attrSpec->type);
        CVar15 = generateRandomAttribData
                           (&attrDataBuf->attrDataBuf,piVar12 + lVar44,attrSpec,uVar35,rnd);
        if (2 < iVar13) {
          puVar11 = (attrDataBuf->attrDataBuf).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (0 < (int)uVar35) {
            iVar16 = 2;
            uVar34 = (ulong)uVar35;
            do {
              puVar1 = puVar11 + (long)iVar16 * 4 + (long)(int)CVar15;
              puVar1[0] = '\0';
              puVar1[1] = '\0';
              puVar1[2] = 0x80;
              puVar1[3] = 0xbf;
              iVar16 = iVar16 + iVar13;
              uVar34 = uVar34 - 1;
            } while (uVar34 != 0);
          }
          if (0 < (int)(uVar35 - 2)) {
            uVar34 = 0;
            do {
              iVar16 = (int)uVar34;
              lVar40 = (long)(iVar13 * iVar16);
              uVar34 = uVar34 + 1;
              lVar45 = (long)((int)uVar34 * iVar13);
              lVar42 = (long)((iVar16 + 2) * iVar13);
              local_a70._0_8_ = *(TestLog **)(puVar11 + lVar40 * 4 + (long)(int)CVar15);
              local_7e8._0_8_ = *(TestLog **)(puVar11 + lVar45 * 4 + (long)(int)CVar15);
              local_330._0_8_ = *(TestLog **)(puVar11 + lVar42 * 4 + (long)(int)CVar15);
              local_c18._0_4_ = R;
              local_c18._4_4_ = SNORM_INT8;
              lVar41 = 0;
              do {
                *(float *)(local_c10 + lVar41 * 4 + -8) =
                     *(float *)(local_7e8 + lVar41 * 4) - *(float *)(local_a70 + lVar41 * 4);
                lVar41 = lVar41 + 1;
              } while (lVar41 == 1);
              local_dd8 = (undefined1  [8])0x0;
              lVar41 = 0;
              do {
                *(float *)(local_dd8 + lVar41 * 4) =
                     *(float *)(local_330 + lVar41 * 4) - *(float *)(local_a70 + lVar41 * 4);
                lVar41 = lVar41 + 1;
              } while (lVar41 == 1);
              fVar50 = (float)local_c18._0_4_ * (float)local_dd8._4_4_ -
                       (float)local_dd8._0_4_ * (float)local_c18._4_4_;
              uVar43 = -(uint)(-fVar50 <= fVar50);
              fVar50 = (float)(~uVar43 & (uint)-fVar50 | (uint)fVar50 & uVar43) * 0.5;
              fVar50 = fVar50 / (fVar50 + 1.0);
              fVar50 = (1.0 - fVar50) * (attrSpec->minValue).f[2] +
                       fVar50 * (attrSpec->maxValue).f[2];
              uVar43 = -(uint)(fVar50 <= *(float *)(puVar11 + lVar40 * 4 + (long)(int)CVar15 + 8));
              *(uint *)(puVar11 + lVar40 * 4 + (long)(int)CVar15 + 8) =
                   uVar43 & (uint)*(float *)(puVar11 + lVar40 * 4 + (long)(int)CVar15 + 8) |
                   ~uVar43 & (uint)fVar50;
              uVar43 = -(uint)(fVar50 <= *(float *)(puVar11 + lVar45 * 4 + (long)(int)CVar15 + 8));
              *(uint *)(puVar11 + lVar45 * 4 + (long)(int)CVar15 + 8) =
                   uVar43 & (uint)*(float *)(puVar11 + lVar45 * 4 + (long)(int)CVar15 + 8) |
                   ~uVar43 & (uint)fVar50;
              uVar43 = -(uint)(fVar50 <= *(float *)(puVar11 + lVar42 * 4 + (long)(int)CVar15 + 8));
              *(uint *)(puVar11 + lVar42 * 4 + (long)(int)CVar15 + 8) =
                   uVar43 & (uint)*(float *)(puVar11 + lVar42 * 4 + (long)(int)CVar15 + 8) |
                   ~uVar43 & (uint)fVar50;
            } while (uVar34 != uVar35 - 2);
          }
        }
        local_c18._0_4_ = CVar15;
        __position._M_current =
             (attrDataBuf->attrDataOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (attrDataBuf->attrDataOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (this_08,__position,(int *)local_c18);
        }
        else {
LAB_0047dbec:
          *__position._M_current = CVar15;
          (attrDataBuf->attrDataOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)((ChannelOrder *)__position._M_current + 1);
        }
      }
      else {
        CVar15 = generateRandomAttribData
                           (&attrDataBuf->attrDataBuf,
                            (attrDataBuf->attrDataSizes).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar44,attrSpec,uVar35,rnd);
        local_c18._0_4_ = CVar15;
        __position._M_current =
             (attrDataBuf->attrDataOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current !=
            (attrDataBuf->attrDataOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_0047dbec;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (this_08,__position,(int *)local_c18);
      }
      lVar44 = lVar44 + 1;
      lVar42 = (long)(pPVar18->attributes).
                     super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>.
                     _M_impl.super__Vector_impl_data._M_start;
    } while (lVar44 < (int)((ulong)((long)(pPVar18->attributes).
                                          super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - lVar42) >> 3)
                      * 0x3cf3cf3d);
  }
  fVar50 = deRandom_getFloat(&rnd->m_rnd);
  if ((this->m_probabilities).clientMemoryAttributeData <= fVar50) {
    if (fVar3 <= fVar49) {
      uVar35 = this->m_redundantBufferFactor;
      dVar14 = deRandom_getUint32(&rnd->m_rnd);
      uVar43 = 0;
      if (0 < this->m_redundantBufferFactor) {
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c18);
          std::ostream::operator<<((ostringstream *)local_c18,uVar43);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c18);
          std::ios_base::~ios_base(local_ba8);
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_a70,0,(char *)0x0,(ulong)local_e40);
          local_dd8 = (undefined1  [8])local_dc8;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar20 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar20 == paVar32) {
            local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
            local_dc8[0]._8_8_ = puVar20[3];
          }
          else {
            local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
            local_dd8 = (undefined1  [8])*puVar20;
          }
          local_dd0 = puVar20[1];
          *puVar20 = paVar32;
          puVar20[1] = 0;
          *(undefined1 *)(puVar20 + 2) = 0;
          if ((TestLog *)local_a70._0_8_ != (TestLog *)(local_a70 + 0x10)) {
            operator_delete((void *)local_a70._0_8_,(ulong)(local_a60[0]._M_allocated_capacity + 1))
            ;
          }
          pGVar9 = this->m_buffers;
          cVar26 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                           *)pGVar9,(key_type *)local_dd8);
          p_Var36 = &(pGVar9->m_objects)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar26._M_node == p_Var36) {
            LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::make
                      (this->m_buffers,(string *)local_dd8);
          }
          cVar27 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                           *)this->m_buffers,(key_type *)local_dd8);
          pBVar10 = *(Buffer **)(cVar27._M_node + 2);
          if (((_Rb_tree_header *)cVar26._M_node == p_Var36) ||
             (fVar50 = deRandom_getFloat(&rnd->m_rnd),
             fVar50 < (this->m_probabilities).reuploadBuffer)) {
            LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
            removeGarbageUntilUnder
                      (this->m_buffers,
                       pBVar10->m_dataSizeApprox + this->m_maxBufMemoryUsageBytes +
                       (*(int *)&(attrDataBuf->attrDataBuf).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start -
                       *(int *)&(attrDataBuf->attrDataBuf).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish),rnd);
            fVar50 = deRandom_getFloat(&rnd->m_rnd);
            CVar15 = 0x8892;
            if (fVar50 < (this->m_probabilities).randomBufferUploadTarget) {
              if (this->m_isGLES3 == true) {
                local_c18 = (undefined1  [8])((ulong)(uint)local_c18._4_4_ << 0x20);
                de::Random::choose<unsigned_int_const*,unsigned_int*>
                          (rnd,(uint *)bufferTargets,(uint *)&bufferTargetsGLES2,(uint *)local_c18,1
                          );
              }
              else {
                local_c18 = (undefined1  [8])((ulong)(uint)local_c18._4_4_ << 0x20);
                de::Random::choose<unsigned_int_const*,unsigned_int*>
                          (rnd,(uint *)&bufferTargetsGLES2,(uint *)&DAT_0067e4a8,(uint *)local_c18,1
                          );
              }
              CVar15 = local_c18._0_4_;
            }
            if (((_Rb_tree_header *)cVar26._M_node == p_Var36) ||
               (fVar50 = deRandom_getFloat(&rnd->m_rnd),
               fVar50 < (this->m_probabilities).reuploadWithBufferData)) {
              fVar50 = deRandom_getFloat(&rnd->m_rnd);
              if ((this->m_probabilities).randomBufferUsage <= fVar50) {
                CVar39 = this->m_attrBufferUsage;
              }
              else {
                if (this->m_isGLES3 == true) {
                  local_c18 = (undefined1  [8])((ulong)(uint)local_c18._4_4_ << 0x20);
                  de::Random::choose<unsigned_int_const*,unsigned_int*>
                            (rnd,(uint *)bufferUsages,(uint *)bufferUsagesGLES2,(uint *)local_c18,1)
                  ;
                }
                else {
                  local_c18 = (undefined1  [8])((ulong)(uint)local_c18._4_4_ << 0x20);
                  de::Random::choose<unsigned_int_const*,unsigned_int*>
                            (rnd,(uint *)bufferUsagesGLES2,(uint *)&DAT_0067e4e0,(uint *)local_c18,1
                            );
                }
                CVar39 = local_c18._0_4_;
              }
              puVar11 = (attrDataBuf->attrDataBuf).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
              LongStressCaseInternal::Buffer::setData
                        (pBVar10,puVar11,
                         *(int *)&(attrDataBuf->attrDataBuf).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (int)puVar11,CVar15,
                         CVar39);
            }
            else {
              puVar11 = (attrDataBuf->attrDataBuf).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
              LongStressCaseInternal::Buffer::setSubData
                        (pBVar10,puVar11,0,
                         *(int *)&(attrDataBuf->attrDataBuf).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (int)puVar11,CVar15);
            }
          }
          if ((uVar43 == dVar14 % uVar35) &&
             (lVar42 = (long)(pPVar18->attributes).
                             super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                             ._M_impl.super__Vector_impl_data._M_start,
             0 < (int)((ulong)((long)(pPVar18->attributes).
                                     super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - lVar42) >> 3) *
                 0x3cf3cf3d)) {
            lVar44 = 0;
            lVar45 = 0;
            do {
              LongStressCaseInternal::Program::setAttribute
                        (pPVar6,pBVar10,
                         (this_08->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar45],(VarSpec *)(lVar42 + lVar44),
                         &attrDataBuf->shaderNameManglingSuffix);
              lVar45 = lVar45 + 1;
              lVar42 = (long)(pPVar18->attributes).
                             super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              lVar44 = lVar44 + 0xa8;
            } while (lVar45 < (int)((ulong)((long)(pPVar18->attributes).
                                                  super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           lVar42) >> 3) * 0x3cf3cf3d);
          }
          if (local_dd8 != (undefined1  [8])local_dc8) {
            operator_delete((void *)local_dd8,(ulong)(local_dc8[0]._M_allocated_capacity + 1));
          }
          uVar43 = uVar43 + 1;
        } while ((int)uVar43 < this->m_redundantBufferFactor);
      }
    }
    else if (0 < (int)((ulong)((long)(pPVar18->attributes).
                                     super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pPVar18->attributes).
                                    super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x3cf3cf3d) {
      local_8d0 = &attrDataBuf->shaderNameManglingSuffix;
      local_e78 = 0;
      do {
        uVar35 = this->m_redundantBufferFactor;
        dVar14 = deRandom_getUint32(&rnd->m_rnd);
        if (0 < this->m_redundantBufferFactor) {
          uVar43 = 0;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c18);
            std::ostream::operator<<((ostringstream *)local_c18,(int)local_e78);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c18);
            std::ios_base::~ios_base(local_ba8);
            plVar19 = (long *)std::__cxx11::string::replace
                                        ((ulong)local_330,0,(char *)0x0,(ulong)local_c58);
            local_7e8._0_8_ = &local_7d8;
            pTVar30 = (TestLog *)(plVar19 + 2);
            if ((TestLog *)*plVar19 == pTVar30) {
              local_7d8.m_log = pTVar30->m_log;
              lStack_7d0 = plVar19[3];
            }
            else {
              local_7d8.m_log = pTVar30->m_log;
              local_7e8._0_8_ = (TestLog *)*plVar19;
            }
            local_7e8._8_8_ = plVar19[1];
            *plVar19 = (long)pTVar30;
            plVar19[1] = 0;
            *(undefined1 *)(plVar19 + 2) = 0;
            plVar19 = (long *)std::__cxx11::string::append(local_7e8);
            local_a70._0_8_ = local_a70 + 0x10;
            pTVar30 = (TestLog *)(plVar19 + 2);
            if ((TestLog *)*plVar19 == pTVar30) {
              local_a60[0]._0_8_ = pTVar30->m_log;
              local_a60[0]._8_8_ = plVar19[3];
            }
            else {
              local_a60[0]._0_8_ = pTVar30->m_log;
              local_a70._0_8_ = (TestLog *)*plVar19;
            }
            local_a70._8_8_ = plVar19[1];
            *plVar19 = (long)pTVar30;
            plVar19[1] = 0;
            *(undefined1 *)(plVar19 + 2) = 0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c18);
            std::ostream::operator<<((ostringstream *)local_c18,uVar43);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c18);
            std::ios_base::~ios_base(local_ba8);
            uVar37 = (qpTestLog *)0xf;
            if ((TestLog *)local_a70._0_8_ != (TestLog *)(local_a70 + 0x10)) {
              uVar37 = local_a60[0]._M_allocated_capacity;
            }
            if ((ulong)uVar37 < (qpTestLog *)(local_4b0._8_8_ + local_a70._8_8_)) {
              TVar38.m_log = (qpTestLog *)0xf;
              if ((TestLog *)local_4b0._0_8_ != local_4a0) {
                TVar38.m_log = local_4a0[0].m_log;
              }
              if (TVar38.m_log < (qpTestLog *)(local_4b0._8_8_ + local_a70._8_8_))
              goto LAB_0047df1d;
              puVar20 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)local_4b0,0,(char *)0x0,local_a70._0_8_);
            }
            else {
LAB_0047df1d:
              puVar20 = (undefined8 *)std::__cxx11::string::_M_append(local_a70,local_4b0._0_8_);
            }
            local_dd8 = (undefined1  [8])local_dc8;
            paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar20 == paVar32) {
              local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
              local_dc8[0]._8_8_ = puVar20[3];
            }
            else {
              local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
              local_dd8 = (undefined1  [8])*puVar20;
            }
            local_dd0 = puVar20[1];
            *puVar20 = paVar32;
            puVar20[1] = 0;
            paVar32->_M_local_buf[0] = '\0';
            if ((TestLog *)local_4b0._0_8_ != local_4a0) {
              operator_delete((void *)local_4b0._0_8_,
                              (ulong)((long)&(local_4a0[0].m_log)->flags + 1));
            }
            if ((TestLog *)local_a70._0_8_ != (TestLog *)(local_a70 + 0x10)) {
              operator_delete((void *)local_a70._0_8_,
                              (ulong)(local_a60[0]._M_allocated_capacity + 1));
            }
            if ((TestLog *)local_7e8._0_8_ != &local_7d8) {
              operator_delete((void *)local_7e8._0_8_,(ulong)((long)&(local_7d8.m_log)->flags + 1));
            }
            if ((TestLog *)local_330._0_8_ != local_320) {
              operator_delete((void *)local_330._0_8_,
                              (ulong)((long)&(local_320[0].m_log)->flags + 1));
            }
            pGVar9 = this->m_buffers;
            cVar26 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                             *)pGVar9,(key_type *)local_dd8);
            p_Var36 = &(pGVar9->m_objects)._M_t._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)cVar26._M_node == p_Var36) {
              LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
              make(this->m_buffers,(string *)local_dd8);
            }
            cVar27 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                             *)this->m_buffers,(key_type *)local_dd8);
            pBVar10 = *(Buffer **)(cVar27._M_node + 2);
            if (((_Rb_tree_header *)cVar26._M_node == p_Var36) ||
               (fVar50 = deRandom_getFloat(&rnd->m_rnd),
               fVar50 < (this->m_probabilities).reuploadBuffer)) {
              LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
              removeGarbageUntilUnder
                        (this->m_buffers,
                         (this->m_maxBufMemoryUsageBytes -
                         (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[local_e78]) + pBVar10->m_dataSizeApprox,
                         rnd);
              fVar50 = deRandom_getFloat(&rnd->m_rnd);
              CVar15 = 0x8892;
              if (fVar50 < (this->m_probabilities).randomBufferUploadTarget) {
                if (this->m_isGLES3 == true) {
                  local_c18 = (undefined1  [8])((ulong)(uint)local_c18._4_4_ << 0x20);
                  de::Random::choose<unsigned_int_const*,unsigned_int*>
                            (rnd,(uint *)bufferTargets,(uint *)&bufferTargetsGLES2,(uint *)local_c18
                             ,1);
                }
                else {
                  local_c18 = (undefined1  [8])((ulong)(uint)local_c18._4_4_ << 0x20);
                  de::Random::choose<unsigned_int_const*,unsigned_int*>
                            (rnd,(uint *)&bufferTargetsGLES2,(uint *)&DAT_0067e4a8,(uint *)local_c18
                             ,1);
                }
                CVar15 = local_c18._0_4_;
              }
              if (((_Rb_tree_header *)cVar26._M_node == p_Var36) ||
                 (fVar50 = deRandom_getFloat(&rnd->m_rnd),
                 fVar50 < (this->m_probabilities).reuploadWithBufferData)) {
                iVar13 = (attrDataBuf->attrDataOffsets).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[local_e78];
                puVar11 = (attrDataBuf->attrDataBuf).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                iVar16 = (attrDataBuf->attrDataSizes).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[local_e78];
                fVar50 = deRandom_getFloat(&rnd->m_rnd);
                if ((this->m_probabilities).randomBufferUsage <= fVar50) {
                  CVar39 = this->m_attrBufferUsage;
                }
                else {
                  if (this->m_isGLES3 == true) {
                    local_c18 = (undefined1  [8])((ulong)(uint)local_c18._4_4_ << 0x20);
                    de::Random::choose<unsigned_int_const*,unsigned_int*>
                              (rnd,(uint *)bufferUsages,(uint *)bufferUsagesGLES2,(uint *)local_c18,
                               1);
                  }
                  else {
                    local_c18 = (undefined1  [8])((ulong)(uint)local_c18._4_4_ << 0x20);
                    de::Random::choose<unsigned_int_const*,unsigned_int*>
                              (rnd,(uint *)bufferUsagesGLES2,(uint *)&DAT_0067e4e0,(uint *)local_c18
                               ,1);
                  }
                  CVar39 = local_c18._0_4_;
                }
                LongStressCaseInternal::Buffer::setData
                          (pBVar10,puVar11 + iVar13,iVar16,CVar15,CVar39);
              }
              else {
                LongStressCaseInternal::Buffer::setSubData
                          (pBVar10,(attrDataBuf->attrDataBuf).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                                   (attrDataBuf->attrDataOffsets).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[local_e78],0,
                           (attrDataBuf->attrDataSizes).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[local_e78],CVar15);
              }
            }
            if (dVar14 % uVar35 == uVar43) {
              LongStressCaseInternal::Program::setAttribute
                        (pPVar6,pBVar10,0,
                         (VarSpec *)
                         ((long)(pPVar18->attributes).
                                super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                ._M_impl.super__Vector_impl_data._M_start + local_e78 * 0xa8),
                         local_8d0);
            }
            if (local_dd8 != (undefined1  [8])local_dc8) {
              operator_delete((void *)local_dd8,(ulong)(local_dc8[0]._M_allocated_capacity + 1));
            }
            uVar43 = uVar43 + 1;
          } while ((int)uVar43 < this->m_redundantBufferFactor);
        }
        local_e78 = local_e78 + 1;
      } while (local_e78 <
               (int)((ulong)((long)(pPVar18->attributes).
                                   super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pPVar18->attributes).
                                  super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x3cf3cf3d);
    }
  }
  else {
    lVar42 = (long)(pPVar18->attributes).
                   super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(pPVar18->attributes).
                                super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                ._M_impl.super__Vector_impl_data._M_finish - lVar42) >> 3) *
            0x3cf3cf3d) {
      lVar44 = 0;
      lVar45 = 0;
      do {
        LongStressCaseInternal::Program::setAttributeClientMem
                  (pPVar6,(attrDataBuf->attrDataBuf).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                          (attrDataBuf->attrDataOffsets).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar45],(VarSpec *)(lVar42 + lVar44),
                   &attrDataBuf->shaderNameManglingSuffix);
        lVar45 = lVar45 + 1;
        lVar42 = (long)(pPVar18->attributes).
                       super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        lVar44 = lVar44 + 0xa8;
      } while (lVar45 < (int)((ulong)((long)(pPVar18->attributes).
                                            super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                            ._M_impl.super__Vector_impl_data._M_finish - lVar42) >>
                             3) * 0x3cf3cf3d);
    }
  }
  glwViewport(0,0,local_ddc,local_de0);
  glwClearDepthf(1.0);
  glwClear(0x100);
  glwEnable(0xb71);
  if (0 < this->m_numDrawCallsPerIteration) {
    iVar13 = 0;
    do {
      glwUseProgram(pPVar6->m_programGL);
      LongStressCaseInternal::Program::setRandomUniforms
                (pPVar6,&pPVar18->uniforms,&attrDataBuf->shaderNameManglingSuffix,rnd);
      if (fVar2 <= fVar48) {
        if (fVar51 <= fVar47) {
          cVar26 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                           *)this->m_buffers,&local_e20);
          glwBindBuffer(0x8893,**(GLuint **)(cVar26._M_node + 2));
          glwDrawElements(5,this->m_numVerticesPerDrawCall,0x1403,(void *)0x0);
        }
        else {
          glwBindBuffer(0x8893,0);
          glwDrawElements(5,this->m_numVerticesPerDrawCall,0x1403,
                          (this->m_vertexIndices).
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        glwDrawArrays(5,0,this->m_numVerticesPerDrawCall);
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < this->m_numDrawCallsPerIteration);
  }
  lVar42 = (long)(pPVar18->attributes).
                 super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>._M_impl
                 .super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pPVar18->attributes).
                              super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                              ._M_impl.super__Vector_impl_data._M_finish - lVar42) >> 3) *
          0x3cf3cf3d) {
    lVar44 = 0;
    lVar45 = 0;
    do {
      LongStressCaseInternal::Program::disableAttributeArray
                (pPVar6,(VarSpec *)(lVar42 + lVar44),&attrDataBuf->shaderNameManglingSuffix);
      lVar45 = lVar45 + 1;
      lVar42 = (long)(pPVar18->attributes).
                     super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      lVar44 = lVar44 + 0xa8;
    } while (lVar45 < (int)((ulong)((long)(pPVar18->attributes).
                                          super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - lVar42) >> 3)
                      * 0x3cf3cf3d);
  }
  if (this->m_showDebugInfo != false) {
    this_07 = this->m_debugInfoRenderer;
    dVar28 = deGetTime();
    dVar21 = this->m_startTimeSeconds;
    iVar16 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::
             computeApproxMemUsage(this->m_textures);
    iVar13 = this->m_maxTexMemoryUsageBytes;
    bufMem = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
             computeApproxMemUsage(this->m_buffers);
    LongStressCaseInternal::DebugInfoRenderer::drawInfo
              (this_07,dVar28 - dVar21,iVar16,iVar13,bufMem,this->m_maxBufMemoryUsageBytes,
               this->m_currentIteration);
  }
  if (0 < this->m_currentIteration) {
    dVar21 = deGetTime();
    uVar34 = dVar21 - this->m_lastLogTime;
    iVar13 = this->m_currentIteration - this->m_lastLogIteration;
    if ((9 < uVar34) || (this->m_currentIteration == this->m_numIterations + -1)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
      std::ostream::operator<<(local_628,this->m_currentLogEntryNdx);
      pTVar30 = local_a98;
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
      std::ios_base::~ios_base(local_5b8);
      plVar19 = (long *)std::__cxx11::string::replace((ulong)local_808,0,(char *)0x0,0x67eaa6);
      local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
      psVar31 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar31) {
        local_a90.field_2._M_allocated_capacity = *psVar31;
        local_a90.field_2._8_8_ = plVar19[3];
      }
      else {
        local_a90.field_2._M_allocated_capacity = *psVar31;
        local_a90._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_a90._M_string_length = plVar19[1];
      *plVar19 = (long)psVar31;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
      std::ostream::operator<<(local_628,this->m_currentLogEntryNdx);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
      std::ios_base::~ios_base(local_5b8);
      plVar19 = (long *)std::__cxx11::string::replace((ulong)local_828,0,(char *)0x0,0x67eaaf);
      local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
      psVar31 = (size_type *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar31) {
        local_8f0.field_2._M_allocated_capacity = *psVar31;
        local_8f0.field_2._8_8_ = plVar19[3];
      }
      else {
        local_8f0.field_2._M_allocated_capacity = *psVar31;
        local_8f0._M_dataplus._M_p = (pointer)*plVar19;
      }
      local_8f0._M_string_length = plVar19[1];
      *plVar19 = (long)psVar31;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      tcu::LogSection::LogSection(&local_668,&local_a90,&local_8f0);
      tcu::TestLog::startSection
                (pTVar30,local_668.m_name._M_dataplus._M_p,local_668.m_description._M_dataplus._M_p)
      ;
      local_1b0._0_8_ = pTVar30;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Time elapsed: ",0xe);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
      poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)local_628);
      std::__ostream_insert<char,std::char_traits<char>>(poVar29,"d ",2);
      poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)poVar29);
      std::__ostream_insert<char,std::char_traits<char>>(poVar29,"h ",2);
      poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)poVar29);
      std::__ostream_insert<char,std::char_traits<char>>(poVar29,"m ",2);
      poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)poVar29);
      std::__ostream_insert<char,std::char_traits<char>>(poVar29,"s",1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
      std::ios_base::~ios_base(local_5b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),(char *)local_848,local_840);
      local_4b0._0_8_ =
           tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      this_01 = (ostringstream *)(local_4b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"Frame number: ",0xe);
      std::ostream::operator<<(this_01,this->m_currentIteration);
      local_330._0_8_ =
           tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      this_02 = (ostringstream *)(local_330 + 8);
      std::__cxx11::ostringstream::ostringstream(this_02);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_02,"Time since last log entry: ",0x1b);
      std::ostream::_M_insert<unsigned_long>((ulong)this_02);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_02,"s",1);
      local_7e8._0_8_ =
           tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
      this_03 = (ostringstream *)(local_7e8 + 8);
      std::__cxx11::ostringstream::ostringstream(this_03);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_03,"Frames since last log entry: ",0x1d);
      std::ostream::operator<<(this_03,iVar13);
      local_a70._0_8_ =
           tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_7e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      this_04 = (ostringstream *)(local_a70 + 8);
      std::__cxx11::ostringstream::ostringstream(this_04);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_04,"Average frame time since last log entry: ",0x29);
      de::floatToString_abi_cxx11_(local_628,(de *)0x2,(float)uVar34 / (float)iVar13,precision);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_04,local_628[0]._M_dataplus._M_p,local_628[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_04,"s",1);
      local_dd8 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_a70,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_dd0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_dd0,"Approximate texture memory usage: ",0x22);
      iVar13 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::
               computeApproxMemUsage(this->m_textures);
      de::floatToString_abi_cxx11_(&local_868,(de *)0x2,(float)iVar13 * 9.536743e-07,precision_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_dd0,local_868._M_dataplus._M_p,local_868._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_dd0," MiB / ",7);
      de::floatToString_abi_cxx11_
                (&local_888,(de *)0x2,(float)this->m_maxTexMemoryUsageBytes * 9.536743e-07,
                 precision_01);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_dd0,local_888._M_dataplus._M_p,local_888._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_dd0," MiB",4);
      local_c18 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_dd8,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream(local_c10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c10,"Approximate buffer memory usage: ",0x21);
      iVar13 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
               computeApproxMemUsage(this->m_buffers);
      de::floatToString_abi_cxx11_(&local_8a8,(de *)0x2,(float)iVar13 * 9.536743e-07,precision_02);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c10,local_8a8._M_dataplus._M_p,local_8a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_c10," MiB / ",7);
      de::floatToString_abi_cxx11_
                (&local_8c8,(de *)0x2,(float)this->m_maxBufMemoryUsageBytes * 9.536743e-07,
                 precision_03);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_c10,local_8c8._M_dataplus._M_p,local_8c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_c10," MiB",4);
      pTVar30 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_c18,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      tcu::TestLog::endSection(pTVar30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
        operator_delete(local_8c8._M_dataplus._M_p,local_8c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
        operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_c10);
      std::ios_base::~ios_base(local_ba0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_888._M_dataplus._M_p != &local_888.field_2) {
        operator_delete(local_888._M_dataplus._M_p,local_888.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_868._M_dataplus._M_p != &local_868.field_2) {
        operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_dd0);
      std::ios_base::~ios_base(local_d60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628[0]._M_dataplus._M_p != &local_628[0].field_2) {
        operator_delete(local_628[0]._M_dataplus._M_p,local_628[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::__cxx11::ostringstream::~ostringstream(this_04);
      std::ios_base::~ios_base(local_9f8);
      std::__cxx11::ostringstream::~ostringstream(this_03);
      std::ios_base::~ios_base(local_770);
      std::__cxx11::ostringstream::~ostringstream(this_02);
      std::ios_base::~ios_base(local_2b8);
      std::__cxx11::ostringstream::~ostringstream(this_01);
      std::ios_base::~ios_base(local_438);
      if (local_848 != local_838) {
        operator_delete(local_848,local_838[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_668.m_description._M_dataplus._M_p != &local_668.m_description.field_2) {
        operator_delete(local_668.m_description._M_dataplus._M_p,
                        local_668.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_668.m_name._M_dataplus._M_p != &local_668.m_name.field_2) {
        operator_delete(local_668.m_name._M_dataplus._M_p,
                        local_668.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
        operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
      }
      if (local_828[0] != local_818) {
        operator_delete(local_828[0],local_818[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
        operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
      }
      if (local_808[0] != local_7f8) {
        operator_delete(local_808[0],local_7f8[0] + 1);
      }
      this->m_lastLogTime = dVar21;
      this->m_lastLogIteration = this->m_currentIteration;
      this->m_currentLogEntryNdx = this->m_currentLogEntryNdx + 1;
    }
  }
  if (0 < (int)((ulong)((long)(pPVar18->textureSpecs).
                              super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       *(long *)&(pPVar18->textureSpecs).
                                 super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                                 ._M_impl) >> 4) * -0x33333333) {
    iVar13 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c18);
      std::ostream::operator<<((ostringstream *)local_c18,iVar13);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c18);
      std::ios_base::~ios_base(local_ba8);
      puVar20 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_a70,0,(char *)0x0,(ulong)local_e00);
      local_dd8 = (undefined1  [8])local_dc8;
      paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar20 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 == paVar32) {
        local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
        local_dc8[0]._8_8_ = puVar20[3];
      }
      else {
        local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
        local_dd8 = (undefined1  [8])*puVar20;
      }
      local_dd0 = puVar20[1];
      *puVar20 = paVar32;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      if ((TestLog *)local_a70._0_8_ != (TestLog *)(local_a70 + 0x10)) {
        operator_delete((void *)local_a70._0_8_,(ulong)(local_a60[0]._M_allocated_capacity + 1));
      }
      fVar51 = deRandom_getFloat(&rnd->m_rnd);
      if ((this->m_probabilities).deleteTexture <= fVar51) {
        fVar51 = deRandom_getFloat(&rnd->m_rnd);
        if (fVar51 < (this->m_probabilities).wastefulTextureMemoryUsage) {
          LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::
          markAsGarbage(this->m_textures,(string *)local_dd8);
        }
      }
      else {
        pGVar7 = this->m_textures;
        pVar52 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>_>
                 ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>_>
                                *)pGVar7,(key_type *)local_dd8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>_>
        ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>_>
                        *)pGVar7,(_Base_ptr)pVar52.first._M_node,(_Base_ptr)pVar52.second._M_node);
      }
      if (local_dd8 != (undefined1  [8])local_dc8) {
        operator_delete((void *)local_dd8,(ulong)(local_dc8[0]._M_allocated_capacity + 1));
      }
      iVar13 = iVar13 + 1;
      iVar16 = (int)((ulong)((long)(pPVar18->textureSpecs).
                                   super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            *(long *)&(pPVar18->textureSpecs).
                                      super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                                      ._M_impl) >> 4);
    } while (SBORROW4(iVar13,iVar16 * -0x33333333) != iVar13 + iVar16 * 0x33333333 < 0);
  }
  pGVar9 = this->m_buffers;
  cVar26 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                   *)pGVar9,&local_e20);
  if ((_Rb_tree_header *)cVar26._M_node != &(pGVar9->m_objects)._M_t._M_impl.super__Rb_tree_header)
  {
    fVar51 = deRandom_getFloat(&rnd->m_rnd);
    if ((this->m_probabilities).deleteBuffer <= fVar51) {
      fVar51 = deRandom_getFloat(&rnd->m_rnd);
      if (fVar51 < (this->m_probabilities).wastefulBufferMemoryUsage) {
        LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
        markAsGarbage(this->m_buffers,&local_e20);
      }
    }
    else {
      pGVar9 = this->m_buffers;
      pVar53 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
               ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                              *)pGVar9,&local_e20);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
      ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                      *)pGVar9,(_Base_ptr)pVar53.first._M_node,(_Base_ptr)pVar53.second._M_node);
    }
  }
  if (fVar3 <= fVar49) {
    pGVar9 = this->m_buffers;
    local_c18 = (undefined1  [8])local_c08;
    std::__cxx11::string::_M_construct<char*>((string *)local_c18,local_e40,lVar5 + (long)local_e40)
    ;
    std::__cxx11::string::append(local_c18);
    cVar26 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                     *)pGVar9,(key_type *)local_c18);
    if (local_c18 != (undefined1  [8])local_c08) {
      operator_delete((void *)local_c18,local_c08[0]._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar26._M_node != &(pGVar9->m_objects)._M_t._M_impl.super__Rb_tree_header
       ) {
      fVar51 = deRandom_getFloat(&rnd->m_rnd);
      if ((this->m_probabilities).deleteBuffer <= fVar51) {
        fVar51 = deRandom_getFloat(&rnd->m_rnd);
        if ((fVar51 < (this->m_probabilities).wastefulBufferMemoryUsage) &&
           (0 < this->m_redundantBufferFactor)) {
          iVar13 = 0;
          do {
            pGVar9 = this->m_buffers;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c18);
            std::ostream::operator<<((ostringstream *)local_c18,iVar13);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c18);
            std::ios_base::~ios_base(local_ba8);
            puVar20 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)local_a70,0,(char *)0x0,(ulong)local_e40)
            ;
            local_dd8 = (undefined1  [8])local_dc8;
            paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar20 == paVar32) {
              local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
              local_dc8[0]._8_8_ = puVar20[3];
            }
            else {
              local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
              local_dd8 = (undefined1  [8])*puVar20;
            }
            local_dd0 = puVar20[1];
            *puVar20 = paVar32;
            puVar20[1] = 0;
            *(undefined1 *)(puVar20 + 2) = 0;
            LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
            markAsGarbage(pGVar9,(string *)local_dd8);
            if (local_dd8 != (undefined1  [8])local_dc8) {
              operator_delete((void *)local_dd8,(ulong)(local_dc8[0]._M_allocated_capacity + 1));
            }
            if ((TestLog *)local_a70._0_8_ != (TestLog *)(local_a70 + 0x10)) {
              operator_delete((void *)local_a70._0_8_,
                              (ulong)(local_a60[0]._M_allocated_capacity + 1));
            }
            iVar13 = iVar13 + 1;
          } while (iVar13 < this->m_redundantBufferFactor);
        }
      }
      else if (0 < this->m_redundantBufferFactor) {
        iVar13 = 0;
        do {
          pGVar9 = this->m_buffers;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c18);
          std::ostream::operator<<((ostringstream *)local_c18,iVar13);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c18);
          std::ios_base::~ios_base(local_ba8);
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_a70,0,(char *)0x0,(ulong)local_e40);
          local_dd8 = (undefined1  [8])local_dc8;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar20 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar20 == paVar32) {
            local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
            local_dc8[0]._8_8_ = puVar20[3];
          }
          else {
            local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
            local_dd8 = (undefined1  [8])*puVar20;
          }
          local_dd0 = puVar20[1];
          *puVar20 = paVar32;
          puVar20[1] = 0;
          *(undefined1 *)(puVar20 + 2) = 0;
          pVar53 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                   ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                                  *)pGVar9,(key_type *)local_dd8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
          ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                          *)pGVar9,(_Base_ptr)pVar53.first._M_node,(_Base_ptr)pVar53.second._M_node)
          ;
          if (local_dd8 != (undefined1  [8])local_dc8) {
            operator_delete((void *)local_dd8,(ulong)(local_dc8[0]._M_allocated_capacity + 1));
          }
          if ((TestLog *)local_a70._0_8_ != (TestLog *)(local_a70 + 0x10)) {
            operator_delete((void *)local_a70._0_8_,(ulong)(local_a60[0]._M_allocated_capacity + 1))
            ;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < this->m_redundantBufferFactor);
      }
    }
  }
  else if (0 < (int)((ulong)((long)(pPVar18->attributes).
                                   super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pPVar18->attributes).
                                  super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x3cf3cf3d) {
    iVar13 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c18);
      std::ostream::operator<<((key_type *)local_c18,iVar13);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c18);
      std::ios_base::~ios_base(local_ba8);
      plVar19 = (long *)std::__cxx11::string::replace
                                  ((ulong)local_7e8,0,(char *)0x0,(ulong)local_c58);
      local_a70._0_8_ = local_a70 + 0x10;
      pTVar30 = (TestLog *)(plVar19 + 2);
      if ((TestLog *)*plVar19 == pTVar30) {
        local_a60[0]._0_8_ = pTVar30->m_log;
        local_a60[0]._8_8_ = plVar19[3];
      }
      else {
        local_a60[0]._0_8_ = pTVar30->m_log;
        local_a70._0_8_ = (TestLog *)*plVar19;
      }
      local_a70._8_8_ = plVar19[1];
      *plVar19 = (long)pTVar30;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append((char *)local_a70);
      local_dd8 = (undefined1  [8])local_dc8;
      paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar20 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 == paVar32) {
        local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
        local_dc8[0]._8_8_ = puVar20[3];
      }
      else {
        local_dc8[0]._0_8_ = paVar32->_M_allocated_capacity;
        local_dd8 = (undefined1  [8])*puVar20;
      }
      local_dd0 = puVar20[1];
      *puVar20 = paVar32;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      if ((TestLog *)local_a70._0_8_ != (TestLog *)(local_a70 + 0x10)) {
        operator_delete((void *)local_a70._0_8_,(ulong)(local_a60[0]._M_allocated_capacity + 1));
      }
      if ((TestLog *)local_7e8._0_8_ != &local_7d8) {
        operator_delete((void *)local_7e8._0_8_,(ulong)((long)&(local_7d8.m_log)->flags + 1));
      }
      pGVar9 = this->m_buffers;
      local_c18 = (undefined1  [8])local_c08;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c18,local_dd8,(char *)((long)local_dd8 + local_dd0));
      std::__cxx11::string::append((char *)local_c18);
      cVar26 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                       *)pGVar9,(key_type *)local_c18);
      if (local_c18 != (undefined1  [8])local_c08) {
        operator_delete((void *)local_c18,local_c08[0]._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)cVar26._M_node !=
          &(pGVar9->m_objects)._M_t._M_impl.super__Rb_tree_header) {
        fVar51 = deRandom_getFloat(&rnd->m_rnd);
        if ((this->m_probabilities).deleteBuffer <= fVar51) {
          fVar51 = deRandom_getFloat(&rnd->m_rnd);
          if ((fVar51 < (this->m_probabilities).wastefulBufferMemoryUsage) &&
             (0 < this->m_redundantBufferFactor)) {
            iVar16 = 0;
            do {
              pGVar9 = this->m_buffers;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c18);
              std::ostream::operator<<((key_type *)local_c18,iVar16);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c18);
              std::ios_base::~ios_base(local_ba8);
              plVar19 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_7e8,0,(char *)0x0,(ulong)local_dd8);
              local_a70._0_8_ = local_a70 + 0x10;
              pTVar30 = (TestLog *)(plVar19 + 2);
              if ((TestLog *)*plVar19 == pTVar30) {
                local_a60[0]._0_8_ = pTVar30->m_log;
                local_a60[0]._8_8_ = plVar19[3];
              }
              else {
                local_a60[0]._0_8_ = pTVar30->m_log;
                local_a70._0_8_ = (TestLog *)*plVar19;
              }
              local_a70._8_8_ = plVar19[1];
              *plVar19 = (long)pTVar30;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
              markAsGarbage(pGVar9,(key_type *)local_a70);
              if ((TestLog *)local_a70._0_8_ != (TestLog *)(local_a70 + 0x10)) {
                operator_delete((void *)local_a70._0_8_,
                                (ulong)(local_a60[0]._M_allocated_capacity + 1));
              }
              if ((TestLog *)local_7e8._0_8_ != &local_7d8) {
                operator_delete((void *)local_7e8._0_8_,(ulong)((long)&(local_7d8.m_log)->flags + 1)
                               );
              }
              iVar16 = iVar16 + 1;
            } while (iVar16 < this->m_redundantBufferFactor);
          }
        }
        else if (0 < this->m_redundantBufferFactor) {
          iVar16 = 0;
          do {
            pGVar9 = this->m_buffers;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c18);
            std::ostream::operator<<((key_type *)local_c18,iVar16);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c18);
            std::ios_base::~ios_base(local_ba8);
            plVar19 = (long *)std::__cxx11::string::replace
                                        ((ulong)local_7e8,0,(char *)0x0,(ulong)local_dd8);
            local_a70._0_8_ = local_a70 + 0x10;
            pTVar30 = (TestLog *)(plVar19 + 2);
            if ((TestLog *)*plVar19 == pTVar30) {
              local_a60[0]._0_8_ = pTVar30->m_log;
              local_a60[0]._8_8_ = plVar19[3];
            }
            else {
              local_a60[0]._0_8_ = pTVar30->m_log;
              local_a70._0_8_ = (TestLog *)*plVar19;
            }
            local_a70._8_8_ = plVar19[1];
            *plVar19 = (long)pTVar30;
            plVar19[1] = 0;
            *(undefined1 *)(plVar19 + 2) = 0;
            pVar53 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                     ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                                    *)pGVar9,(key_type *)local_a70);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
            ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
                            *)pGVar9,(_Base_ptr)pVar53.first._M_node,
                           (_Base_ptr)pVar53.second._M_node);
            if ((TestLog *)local_a70._0_8_ != (TestLog *)(local_a70 + 0x10)) {
              operator_delete((void *)local_a70._0_8_,
                              (ulong)(local_a60[0]._M_allocated_capacity + 1));
            }
            if ((TestLog *)local_7e8._0_8_ != &local_7d8) {
              operator_delete((void *)local_7e8._0_8_,(ulong)((long)&(local_7d8.m_log)->flags + 1));
            }
            iVar16 = iVar16 + 1;
          } while (iVar16 < this->m_redundantBufferFactor);
        }
      }
      if (local_dd8 != (undefined1  [8])local_dc8) {
        operator_delete((void *)local_dd8,(ulong)(local_dc8[0]._M_allocated_capacity + 1));
      }
      iVar13 = iVar13 + 1;
      iVar16 = (int)((ulong)((long)(pPVar18->attributes).
                                   super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pPVar18->attributes).
                                  super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
    } while (SBORROW4(iVar13,iVar16 * 0x3cf3cf3d) != iVar13 + iVar16 * -0x3cf3cf3d < 0);
  }
  GVar17 = glwGetError();
  glu::checkError(GVar17,"End of LongStressCase::iterate()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLongStressCase.cpp"
                  ,0x625);
  iVar13 = this->m_currentIteration + 1;
  this->m_currentIteration = iVar13;
  bVar46 = iVar13 != this->m_numIterations;
  if (!bVar46) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Passed");
  }
  if (local_c58 != &local_c48) {
    operator_delete(local_c58,local_c48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e20._M_dataplus._M_p != &local_e20.field_2) {
    operator_delete(local_e20._M_dataplus._M_p,local_e20.field_2._M_allocated_capacity + 1);
  }
  if (local_e40 != &local_e30) {
    operator_delete(local_e40,local_e30 + 1);
  }
  if (local_e00 != &local_df0) {
    operator_delete(local_e00,local_df0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c38._M_dataplus._M_p != &local_c38.field_2) {
    operator_delete(local_c38._M_dataplus._M_p,local_c38.field_2._M_allocated_capacity + 1);
  }
  return (uint)bVar46;
}

Assistant:

LongStressCase::IterateResult LongStressCase::iterate (void)
{
	TestLog&					log							= m_testCtx.getLog();
	const int					renderWidth					= m_renderCtx.getRenderTarget().getWidth();
	const int					renderHeight				= m_renderCtx.getRenderTarget().getHeight();
	const bool					useClientMemoryIndexData	= m_rnd.getFloat() < m_probabilities.clientMemoryIndexData;
	const bool					useDrawArrays				= m_rnd.getFloat() < m_probabilities.useDrawArrays;
	const bool					separateAttributeBuffers	= m_rnd.getFloat() < m_probabilities.separateAttributeBuffers;
	const int					progContextNdx				= m_rnd.getInt(0, (int)m_programContexts.size()-1);
	const ProgramContext&		programContext				= m_programContexts[progContextNdx];
	ProgramResources&			programResources			= m_programResources[progContextNdx];
	const string				programName					= "prog" + toString(progContextNdx);
	const string				textureNamePrefix			= "tex" + toString(progContextNdx) + "_";
	const string				unitedAttrBufferNamePrefix	= "attrBuf" + toString(progContextNdx) + "_";
	const string				indexBufferName				= "indexBuf" + toString(progContextNdx);
	const string				separateAttrBufNamePrefix	= "attrBuf" + toString(progContextNdx) + "_";

	if (m_currentIteration == 0)
		m_lastLogTime = m_startTimeSeconds = deGetTime();

	// Make or re-compile programs.
	{
		const bool hadProgram = m_programs->has(programName);

		if (!hadProgram)
			m_programs->make(programName);

		Program& prog = m_programs->get(programName);

		if (!hadProgram || m_rnd.getFloat() < m_probabilities.rebuildProgram)
		{
			programResources.shaderNameManglingSuffix = toString((deUint16)deUint64Hash((deUint64)m_currentIteration ^ deGetTime()));

			prog.setSources(mangleShaderNames(programContext.vertexSource, programResources.shaderNameManglingSuffix),
							mangleShaderNames(programContext.fragmentSource, programResources.shaderNameManglingSuffix));

			prog.build(log);
		}

		prog.use();
	}

	Program& program = m_programs->get(programName);

	// Make or re-upload textures.

	for (int texNdx = 0; texNdx < (int)programContext.textureSpecs.size(); texNdx++)
	{
		const string		texName		= textureNamePrefix + toString(texNdx);
		const bool			hadTexture	= m_textures->has(texName);
		const TextureSpec&	spec		= programContext.textureSpecs[texNdx];

		if (!hadTexture)
			m_textures->make(texName, spec.textureType);

		if (!hadTexture || m_rnd.getFloat() < m_probabilities.reuploadTexture)
		{
			Texture& texture = m_textures->get(texName);

			m_textures->removeGarbageUntilUnder(m_maxTexMemoryUsageBytes - texture.getApproxMemUsageDiff(spec.width, spec.height, spec.internalFormat, spec.useMipmap), m_rnd);

			if (!hadTexture || m_rnd.getFloat() < m_probabilities.reuploadWithTexImage)
				texture.setData(programResources.dummyTextures[texNdx]->getAccess(), spec.width, spec.height, spec.internalFormat, spec.useMipmap);
			else
				texture.setSubData(programResources.dummyTextures[texNdx]->getAccess(), 0, 0, spec.width, spec.height);

			texture.toUnit(0);
			texture.setWrap(spec.sWrap, spec.tWrap);
			texture.setFilter(spec.minFilter, spec.magFilter);
		}
	}

	// Bind textures to units, in random order (because when multiple texture specs have same unit, we want to pick one randomly).

	{
		vector<int> texSpecIndices(programContext.textureSpecs.size());
		for (int i = 0; i < (int)texSpecIndices.size(); i++)
			texSpecIndices[i] = i;
		m_rnd.shuffle(texSpecIndices.begin(), texSpecIndices.end());
		for (int i = 0; i < (int)texSpecIndices.size(); i++)
			m_textures->get(textureNamePrefix + toString(texSpecIndices[i])).toUnit(programContext.textureSpecs[i].textureUnit);
	}

	// Make or re-upload index buffer.

	if (!useDrawArrays)
	{
		m_rnd.shuffle(m_vertexIndices.begin(), m_vertexIndices.end());

		if (!useClientMemoryIndexData)
		{
			const bool hadIndexBuffer = m_buffers->has(indexBufferName);

			if (!hadIndexBuffer)
				m_buffers->make(indexBufferName);

			Buffer& indexBuf = m_buffers->get(indexBufferName);

			if (!hadIndexBuffer || m_rnd.getFloat() < m_probabilities.reuploadBuffer)
			{
				m_buffers->removeGarbageUntilUnder(m_maxBufMemoryUsageBytes - indexBuf.getApproxMemUsageDiff(m_vertexIndices), m_rnd);
				const deUint32 target = m_rnd.getFloat() < m_probabilities.randomBufferUploadTarget ? randomBufferTarget(m_rnd, m_isGLES3) : GL_ELEMENT_ARRAY_BUFFER;

				if (!hadIndexBuffer || m_rnd.getFloat() < m_probabilities.reuploadWithBufferData)
					indexBuf.setData(m_vertexIndices, target, m_rnd.getFloat() < m_probabilities.randomBufferUsage ? randomBufferUsage(m_rnd, m_isGLES3) : m_indexBufferUsage);
				else
					indexBuf.setSubData(m_vertexIndices, 0, m_numVerticesPerDrawCall, target);
			}
		}
	}

	// Set vertex attributes. If not using client-memory data, make or re-upload attribute buffers.

	generateAttribs(programResources.attrDataBuf, programResources.attrDataOffsets, programResources.attrDataSizes,
					programContext.attributes, programContext.positionAttrName, m_numVerticesPerDrawCall, m_rnd);

	if (!(m_rnd.getFloat() < m_probabilities.clientMemoryAttributeData))
	{
		if (separateAttributeBuffers)
		{
			for (int attrNdx = 0; attrNdx < (int)programContext.attributes.size(); attrNdx++)
			{
				const int usedRedundantBufferNdx = m_rnd.getInt(0, m_redundantBufferFactor-1);

				for (int redundantBufferNdx = 0; redundantBufferNdx < m_redundantBufferFactor; redundantBufferNdx++)
				{
					const string	curAttrBufName		= separateAttrBufNamePrefix + toString(attrNdx) + "_" + toString(redundantBufferNdx);
					const bool		hadCurAttrBuffer	= m_buffers->has(curAttrBufName);

					if (!hadCurAttrBuffer)
						m_buffers->make(curAttrBufName);

					Buffer& curAttrBuf = m_buffers->get(curAttrBufName);

					if (!hadCurAttrBuffer || m_rnd.getFloat() < m_probabilities.reuploadBuffer)
					{
						m_buffers->removeGarbageUntilUnder(m_maxBufMemoryUsageBytes - curAttrBuf.getApproxMemUsageDiff(programResources.attrDataSizes[attrNdx]), m_rnd);
						const deUint32 target = m_rnd.getFloat() < m_probabilities.randomBufferUploadTarget ? randomBufferTarget(m_rnd, m_isGLES3) : GL_ARRAY_BUFFER;

						if (!hadCurAttrBuffer || m_rnd.getFloat() < m_probabilities.reuploadWithBufferData)
							curAttrBuf.setData(&programResources.attrDataBuf[programResources.attrDataOffsets[attrNdx]], programResources.attrDataSizes[attrNdx], target,
											   m_rnd.getFloat() < m_probabilities.randomBufferUsage ? randomBufferUsage(m_rnd, m_isGLES3) : m_attrBufferUsage);
						else
							curAttrBuf.setSubData(&programResources.attrDataBuf[programResources.attrDataOffsets[attrNdx]], 0, programResources.attrDataSizes[attrNdx], target);
					}

					if (redundantBufferNdx == usedRedundantBufferNdx)
						program.setAttribute(curAttrBuf, 0, programContext.attributes[attrNdx], programResources.shaderNameManglingSuffix);
				}
			}
		}
		else
		{
			const int usedRedundantBufferNdx = m_rnd.getInt(0, m_redundantBufferFactor-1);

			for (int redundantBufferNdx = 0; redundantBufferNdx < m_redundantBufferFactor; redundantBufferNdx++)
			{
				const string	attrBufName		= unitedAttrBufferNamePrefix + toString(redundantBufferNdx);
				const bool		hadAttrBuffer	= m_buffers->has(attrBufName);

				if (!hadAttrBuffer)
					m_buffers->make(attrBufName);

				Buffer& attrBuf = m_buffers->get(attrBufName);

				if (!hadAttrBuffer || m_rnd.getFloat() < m_probabilities.reuploadBuffer)
				{
					m_buffers->removeGarbageUntilUnder(m_maxBufMemoryUsageBytes - attrBuf.getApproxMemUsageDiff(programResources.attrDataBuf), m_rnd);
					const deUint32 target = m_rnd.getFloat() < m_probabilities.randomBufferUploadTarget ? randomBufferTarget(m_rnd, m_isGLES3) : GL_ARRAY_BUFFER;

					if (!hadAttrBuffer || m_rnd.getFloat() < m_probabilities.reuploadWithBufferData)
						attrBuf.setData(programResources.attrDataBuf, target, m_rnd.getFloat() < m_probabilities.randomBufferUsage ? randomBufferUsage(m_rnd, m_isGLES3) : m_attrBufferUsage);
					else
						attrBuf.setSubData(programResources.attrDataBuf, 0, (int)programResources.attrDataBuf.size(), target);
				}

				if (redundantBufferNdx == usedRedundantBufferNdx)
				{
					for (int i = 0; i < (int)programContext.attributes.size(); i++)
						program.setAttribute(attrBuf, programResources.attrDataOffsets[i], programContext.attributes[i], programResources.shaderNameManglingSuffix);
				}
			}
		}
	}
	else
	{
		for (int i = 0; i < (int)programContext.attributes.size(); i++)
			program.setAttributeClientMem(&programResources.attrDataBuf[programResources.attrDataOffsets[i]], programContext.attributes[i], programResources.shaderNameManglingSuffix);
	}

	// Draw.

	glViewport(0, 0, renderWidth, renderHeight);

	glClearDepthf(1.0f);
	glClear(GL_DEPTH_BUFFER_BIT);
	glEnable(GL_DEPTH_TEST);

	for (int i = 0; i < m_numDrawCallsPerIteration; i++)
	{
		program.use();
		program.setRandomUniforms(programContext.uniforms, programResources.shaderNameManglingSuffix, m_rnd);

		if (useDrawArrays)
			glDrawArrays(GL_TRIANGLE_STRIP, 0, m_numVerticesPerDrawCall);
		else
		{
			if (useClientMemoryIndexData)
			{
				glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
				glDrawElements(GL_TRIANGLE_STRIP, m_numVerticesPerDrawCall, GL_UNSIGNED_SHORT, &m_vertexIndices[0]);
			}
			else
			{
				m_buffers->get(indexBufferName).bind(GL_ELEMENT_ARRAY_BUFFER);
				glDrawElements(GL_TRIANGLE_STRIP, m_numVerticesPerDrawCall, GL_UNSIGNED_SHORT, DE_NULL);
			}
		}
	}

	for(int i = 0; i < (int)programContext.attributes.size(); i++)
		program.disableAttributeArray(programContext.attributes[i], programResources.shaderNameManglingSuffix);

	if (m_showDebugInfo)
		m_debugInfoRenderer->drawInfo(deGetTime()-m_startTimeSeconds, m_textures->computeApproxMemUsage(), m_maxTexMemoryUsageBytes, m_buffers->computeApproxMemUsage(), m_maxBufMemoryUsageBytes, m_currentIteration);

	if (m_currentIteration > 0)
	{
		// Log if a certain amount of time has passed since last log entry (or if this is the last iteration).

		const deUint64	loggingIntervalSeconds	= 10;
		const deUint64	time					= deGetTime();
		const deUint64	timeDiff				= time - m_lastLogTime;
		const int		iterDiff				= m_currentIteration - m_lastLogIteration;

		if (timeDiff >= loggingIntervalSeconds || m_currentIteration == m_numIterations-1)
		{
			log << TestLog::Section("LogEntry" + toString(m_currentLogEntryNdx), "Log entry " + toString(m_currentLogEntryNdx))
				<< TestLog::Message << "Time elapsed: " << getTimeStr(time - m_startTimeSeconds) << TestLog::EndMessage
				<< TestLog::Message << "Frame number: " << m_currentIteration << TestLog::EndMessage
				<< TestLog::Message << "Time since last log entry: " << timeDiff << "s" << TestLog::EndMessage
				<< TestLog::Message << "Frames since last log entry: " << iterDiff << TestLog::EndMessage
				<< TestLog::Message << "Average frame time since last log entry: " << de::floatToString((float)timeDiff / (float)iterDiff, 2) << "s" << TestLog::EndMessage
				<< TestLog::Message << "Approximate texture memory usage: "
									<< de::floatToString((float)m_textures->computeApproxMemUsage() / Mi, 2) << " MiB / "
									<< de::floatToString((float)m_maxTexMemoryUsageBytes / Mi, 2) << " MiB"
									<< TestLog::EndMessage
				<< TestLog::Message << "Approximate buffer memory usage: "
										<< de::floatToString((float)m_buffers->computeApproxMemUsage() / Mi, 2) << " MiB / "
										<< de::floatToString((float)m_maxBufMemoryUsageBytes / Mi, 2) << " MiB"
										<< TestLog::EndMessage
				<< TestLog::EndSection;

			m_lastLogTime		= time;
			m_lastLogIteration	= m_currentIteration;
			m_currentLogEntryNdx++;
		}
	}

	// Possibly remove or set-as-garbage some objects, depending on given probabilities.

	for (int texNdx = 0; texNdx < (int)programContext.textureSpecs.size(); texNdx++)
	{
		const string texName = textureNamePrefix + toString(texNdx);
		if (m_rnd.getFloat() < m_probabilities.deleteTexture)
			m_textures->remove(texName);
		else if (m_rnd.getFloat() < m_probabilities.wastefulTextureMemoryUsage)
			m_textures->markAsGarbage(texName);

	}

	if (m_buffers->has(indexBufferName))
	{
		if (m_rnd.getFloat() < m_probabilities.deleteBuffer)
			m_buffers->remove(indexBufferName);
		else if (m_rnd.getFloat() < m_probabilities.wastefulBufferMemoryUsage)
			m_buffers->markAsGarbage(indexBufferName);

	}

	if (separateAttributeBuffers)
	{
		for (int attrNdx = 0; attrNdx < (int)programContext.attributes.size(); attrNdx++)
		{
			const string curAttrBufNamePrefix = separateAttrBufNamePrefix + toString(attrNdx) + "_";

			if (m_buffers->has(curAttrBufNamePrefix + "0"))
			{
				if (m_rnd.getFloat() < m_probabilities.deleteBuffer)
				{
					for (int i = 0; i < m_redundantBufferFactor; i++)
						m_buffers->remove(curAttrBufNamePrefix + toString(i));
				}
				else if (m_rnd.getFloat() < m_probabilities.wastefulBufferMemoryUsage)
				{
					for (int i = 0; i < m_redundantBufferFactor; i++)
						m_buffers->markAsGarbage(curAttrBufNamePrefix + toString(i));
				}
			}
		}
	}
	else
	{
		if (m_buffers->has(unitedAttrBufferNamePrefix + "0"))
		{
			if (m_rnd.getFloat() < m_probabilities.deleteBuffer)
			{
				for (int i = 0; i < m_redundantBufferFactor; i++)
					m_buffers->remove(unitedAttrBufferNamePrefix + toString(i));
			}
			else if (m_rnd.getFloat() < m_probabilities.wastefulBufferMemoryUsage)
			{
				for (int i = 0; i < m_redundantBufferFactor; i++)
					m_buffers->markAsGarbage(unitedAttrBufferNamePrefix + toString(i));
			}
		}
	}

	GLU_CHECK_MSG("End of LongStressCase::iterate()");

	m_currentIteration++;
	if (m_currentIteration == m_numIterations)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Passed");
		return STOP;
	}
	else
		return CONTINUE;
}